

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertPreviewSurfaceShader
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *shader_abs_path,
          UsdPreviewSurface *shader,PreviewSurfaceShader *rshader_out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  Animatable<int> *this_00;
  int val;
  ostringstream ss_e;
  int local_28c;
  string local_288;
  string local_268;
  PreviewSurfaceShader *local_248;
  uint local_240;
  ShaderParam<std::array<float,_3UL>_> SStack_23c;
  ShaderParam<std::array<float,_3UL>_> local_22c;
  ShaderParam<std::array<float,_3UL>_> local_21c;
  ShaderParam<float> SStack_20c;
  ShaderParam<float> local_204;
  ShaderParam<float> SStack_1fc;
  ShaderParam<float> local_1f4;
  ShaderParam<float> SStack_1ec;
  ShaderParam<float> local_1e4;
  ShaderParam<float> SStack_1dc;
  ShaderParam<std::array<float,_3UL>_> local_1d4;
  ShaderParam<float> SStack_1c4;
  ShaderParam<float> local_1bc;
  undefined8 local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (rshader_out == (PreviewSurfaceShader *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ConvertPreviewSurfaceShader",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1323);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"rshader_out arg is nullptr.",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append
              ((char *)&this->_err,CONCAT44(SStack_23c.value._M_elems[0],local_240));
    local_288._M_dataplus._M_p = (pointer)CONCAT44(SStack_23c.value._M_elems[0],local_240);
    if ((int32_t *)local_288._M_dataplus._M_p == &SStack_23c.texture_id) goto LAB_00349015;
    local_288.field_2._M_allocated_capacity =
         CONCAT44(local_22c.value._M_elems[0],SStack_23c.texture_id);
  }
  else {
    local_240 = local_240 & 0xffffff00;
    SStack_23c.value._M_elems[0] = 0.18;
    SStack_23c.value._M_elems[1] = 0.18;
    SStack_23c.value._M_elems[2] = 0.18;
    SStack_23c.texture_id = -1;
    local_22c.value._M_elems[0] = 0.0;
    local_22c.value._M_elems[1] = 0.0;
    local_22c.value._M_elems[2] = 0.0;
    local_22c.texture_id = -1;
    local_21c.value._M_elems[0] = 0.0;
    local_21c.value._M_elems[1] = 0.0;
    local_21c.value._M_elems[2] = 0.0;
    local_21c.texture_id = -1;
    SStack_20c.value = 0.0;
    SStack_20c.texture_id = -1;
    local_204.value = 0.5;
    local_204.texture_id = -1;
    SStack_1fc.value = 0.0;
    SStack_1fc.texture_id = -1;
    local_1f4.value = 0.01;
    local_1f4.texture_id = -1;
    SStack_1ec.value = 1.0;
    SStack_1ec.texture_id = -1;
    local_1e4.value = 0.0;
    local_1e4.texture_id = -1;
    SStack_1dc.value = 1.5;
    SStack_1dc.texture_id = -1;
    local_1d4.value._M_elems[0] = 0.0;
    local_1d4.value._M_elems[1] = 0.0;
    local_1d4.value._M_elems[2] = 1.0;
    local_1d4.texture_id = -1;
    SStack_1c4.value = 0.0;
    SStack_1c4.texture_id = -1;
    local_1bc.value = 0.0;
    local_1bc.texture_id = -1;
    local_1b0 = 0;
    bVar2 = (shader->useSpecularWorkflow)._empty;
    if ((((bVar2 == false) && ((shader->useSpecularWorkflow)._attrib.has_value_ == false)) &&
        ((shader->useSpecularWorkflow)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (shader->useSpecularWorkflow)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start)) && ((shader->useSpecularWorkflow)._blocked != true)) {
LAB_00349096:
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      local_248 = rshader_out;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"diffuseColor","");
      bVar2 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->diffuseColor,local_1a8,&SStack_23c);
      paVar1 = &local_1a8[0].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"emissiveColor","");
      bVar2 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->emissiveColor,local_1a8,&local_22c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"specularColor","");
      bVar2 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::color3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->specularColor,local_1a8,&local_21c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"normal","");
      bVar2 = ConvertPreviewSurfaceShaderParam<tinyusdz::value::normal3f,std::array<float,3ul>>
                        (this,env,shader_abs_path,&shader->normal,local_1a8,&local_1d4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"roughness","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->roughness,local_1a8,&local_204);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"metallic","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->metallic,local_1a8,&SStack_20c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"clearcoat","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->clearcoat,local_1a8,&SStack_1fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"clearcoatRoughness","")
      ;
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->clearcoatRoughness,local_1a8,&local_1f4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"opacity","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->opacity,local_1a8,&SStack_1ec);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"opacityThreshold","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->opacityThreshold,local_1a8,&local_1e4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ior","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->ior,local_1a8,&SStack_1dc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"occlusion","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->occlusion,local_1a8,&local_1bc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"displacement","");
      bVar2 = ConvertPreviewSurfaceShaderParam<float,float>
                        (this,env,shader_abs_path,&shader->displacement,local_1a8,&SStack_1c4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        return false;
      }
      memcpy(local_248,&local_240,0x98);
      return true;
    }
    if ((shader->useSpecularWorkflow)._blocked == true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ConvertPreviewSurfaceShader",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x132b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar5 = "useSpecularWorkflow attribute is blocked.";
      pcVar4 = "";
LAB_00348f61:
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,pcVar5,pcVar4);
      fmt::format(&local_288,&local_268);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_00348fc8:
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if ((shader->useSpecularWorkflow)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (shader->useSpecularWorkflow)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start && bVar2 == true) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ConvertPreviewSurfaceShader",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x132e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        pcVar5 = "TODO: useSpecularWorkflow with connection.";
        pcVar4 = "";
        goto LAB_00348f61;
      }
      this_00 = (Animatable<int> *)&(shader->useSpecularWorkflow)._attrib.contained;
      if ((shader->useSpecularWorkflow)._attrib.has_value_ == false) {
        this_00 = &(shader->useSpecularWorkflow)._fallback;
      }
      bVar2 = Animatable<int>::get(this_00,env->timecode,&local_28c,Linear);
      if (bVar2) {
        local_240 = CONCAT31(local_240._1_3_,local_28c != 0);
        goto LAB_00349096;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ConvertPreviewSurfaceShader",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x1334);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"Failed to get useSpcularWorkflow value at time `{}`.","");
      fmt::format<double>(&local_288,&local_268,&env->timecode);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_288._M_dataplus._M_p,local_288._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) goto LAB_00348fc8;
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_288._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_00349015;
  }
  operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
LAB_00349015:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool RenderSceneConverter::ConvertPreviewSurfaceShader(
    const RenderSceneConverterEnv &env, const Path &shader_abs_path,
    const UsdPreviewSurface &shader, PreviewSurfaceShader *rshader_out) {
  if (!rshader_out) {
    PUSH_ERROR_AND_RETURN("rshader_out arg is nullptr.");
  }

  PreviewSurfaceShader rshader;

  if (shader.useSpecularWorkflow.authored()) {
    if (shader.useSpecularWorkflow.is_blocked()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("useSpecularWorkflow attribute is blocked."));
    } else if (shader.useSpecularWorkflow.is_connection()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("TODO: useSpecularWorkflow with connection."));
    } else {
      int val;
      if (!shader.useSpecularWorkflow.get_value().get(env.timecode, &val)) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("Failed to get useSpcularWorkflow value at time `{}`.",
                        env.timecode));
      }

      rshader.useSpecularWorkflow = val ? true : false;
    }
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.diffuseColor, "diffuseColor",
                                        rshader.diffuseColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.emissiveColor, "emissiveColor",
                                        rshader.emissiveColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.specularColor, "specularColor",
                                        rshader.specularColor)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.normal,
                                        "normal", rshader.normal)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.roughness,
                                        "roughness", rshader.roughness)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.metallic,
                                        "metallic", rshader.metallic)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.clearcoat,
                                        "clearcoat", rshader.clearcoat)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.clearcoatRoughness, "clearcoatRoughness",
          rshader.clearcoatRoughness)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.opacity,
                                        "opacity", rshader.opacity)) {
    return false;
  }
  if (!ConvertPreviewSurfaceShaderParam(
          env, shader_abs_path, shader.opacityThreshold, "opacityThreshold",
          rshader.opacityThreshold)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.ior, "ior",
                                        rshader.ior)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path, shader.occlusion,
                                        "occlusion", rshader.occlusion)) {
    return false;
  }

  if (!ConvertPreviewSurfaceShaderParam(env, shader_abs_path,
                                        shader.displacement, "displacement",
                                        rshader.displacement)) {
    return false;
  }

  (*rshader_out) = rshader;
  return true;
}